

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_del.c
# Opt level: O3

int mpt_path_del(mpt_path *path)

{
  size_t sVar1;
  char *pcVar2;
  ulong uVar3;
  long lVar4;
  uint8_t *puVar5;
  ulong len;
  ulong uVar6;
  mpt_array local_20;
  
  uVar3 = path->len;
  if (uVar3 == 0) {
    return -0x10;
  }
  pcVar2 = path->base;
  sVar1 = path->off;
  if ((char)path->flags < '\0') {
    if (uVar3 == 1) {
      return -2;
    }
    uVar6 = (ulong)(byte)pcVar2[sVar1 + uVar3 + -2];
    lVar4 = uVar3 - uVar6;
    if (uVar3 < uVar6 || lVar4 == 0) {
      return -2;
    }
    puVar5 = (uint8_t *)(pcVar2 + lVar4 + sVar1 + -3);
    if (lVar4 + sVar1 == 2) {
      puVar5 = &path->first;
    }
    if (pcVar2[sVar1 + uVar3 + -2] != *puVar5) {
      return -4;
    }
    len = lVar4 - 2;
  }
  else {
    uVar3 = uVar3 - 1;
    if (uVar3 == 0) {
      len = 0;
      uVar6 = 0;
    }
    else {
      uVar6 = 0;
      len = uVar3;
      do {
        if ((uint)(byte)pcVar2[len + (sVar1 - 1)] == (int)path->sep) goto LAB_0010dff9;
        uVar6 = uVar6 + 1;
        len = len - 1;
      } while (len != 0);
      len = 0;
      uVar6 = uVar3;
    }
  }
LAB_0010dff9:
  if ((path->flags & 0x40) != 0) {
    local_20._buf = (mpt_buffer *)(pcVar2 + -0x20);
    if (*(ulong *)(pcVar2 + -8) < len) {
      return -2;
    }
    pcVar2 = (char *)mpt_array_slice(&local_20,0,len);
    if (pcVar2 == (char *)0x0) {
      return -4;
    }
    path->base = pcVar2;
    (local_20._buf)->_used = len;
  }
  path->len = len;
  if (len == 0) {
    path->first = '\0';
  }
  path->flags = path->flags & 0xfe;
  return (int)uVar6;
}

Assistant:

extern int mpt_path_del(MPT_STRUCT(path) *path)
{
	uint8_t *data;
	size_t len, pos, part;
	
	if (!(len = path->len)) {
		return MPT_ERROR(MissingData);
	}
	data = (uint8_t *) path->base;
	pos  = len + path->off;
	
	/* binary linked size separation format */
	if (path->flags & MPT_PATHFLAG(SepBinary)) {
		/* total length error */
		if (len < 2 || len <= (part = data[pos-2])) {
			return MPT_ERROR(BadValue);
		}
		len -= part + 2;
		pos  = len + path->off;
		
		/* forward/backward inconsistency */
		if (part != (pos ? data[pos-1] : path->first)) {
			return MPT_ERROR(BadOperation);
		}
	}
	else {
		/* start on character before assign */
		data += (pos - 2);
		part  = 0;
		
		/* find last separator */
		while (--len && (*(data) != path->sep)) {
			++part; --data;
		}
	}
	if (path->flags & MPT_PATHFLAG(HasArray)) {
		MPT_STRUCT(array) arr;
		arr._buf = (void *) path->base;
		pos = (--arr._buf)->_used;
		if (len > pos) {
			return MPT_ERROR(BadValue);
		}
		pos = len;
		if (!(data = mpt_array_slice(&arr, 0, pos))) {
			return MPT_ERROR(BadOperation);
		}
		path->base = (char *) data;
		arr._buf->_used = pos;
	}
	
	if (!(path->len = len)) {
		path->first = 0;
	}
	path->flags &= ~MPT_PATHFLAG(KeepPost);
	
	return part;
}